

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

void Sdm_ManReadCnfCosts(Sdm_Man_t *p,int *pCosts,int nCosts)

{
  int iVar1;
  int local_20;
  int i;
  int nCosts_local;
  int *pCosts_local;
  Sdm_Man_t *p_local;
  
  if (nCosts == 0x253) {
    pCosts[1] = 0;
    *pCosts = 0;
    for (local_20 = 2; local_20 < 0x253; local_20 = local_20 + 1) {
      iVar1 = Sdm_ManReadDsdClauseNum(p,local_20);
      pCosts[local_20] = iVar1;
    }
    return;
  }
  __assert_fail("nCosts == DSD_CLASS_NUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                ,0x3fc,"void Sdm_ManReadCnfCosts(Sdm_Man_t *, int *, int)");
}

Assistant:

void Sdm_ManReadCnfCosts( Sdm_Man_t * p, int * pCosts, int nCosts )
{
    int i;
    assert( nCosts == DSD_CLASS_NUM );
    pCosts[0] = pCosts[1] = 0;
    for ( i = 2; i < DSD_CLASS_NUM; i++ )
        pCosts[i] = Sdm_ManReadDsdClauseNum( p, i );
}